

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReptilePeople.cpp
# Opt level: O0

void __thiscall ReptilePeople::ReptilePeople(ReptilePeople *this,string *displayName)

{
  Dice *pDVar1;
  string *displayName_local;
  ReptilePeople *this_local;
  
  Character::Character(&this->super_Character);
  (this->super_Character)._vptr_Character = (_func_int **)&PTR_RollAttack_00110c18;
  std::__cxx11::string::operator=((string *)&(this->super_Character).name,"ReptilePeople");
  std::__cxx11::string::operator=
            ((string *)&(this->super_Character).displayName,(string *)displayName);
  (this->super_Character).alive = true;
  (this->super_Character).attackDieSides = 6;
  (this->super_Character).attackRolls = 3;
  (this->super_Character).defenceDieSides = 6;
  (this->super_Character).defenceRolls = 1;
  (this->super_Character).armor = 7;
  (this->super_Character).totalStrengthPoints = 0x12;
  (this->super_Character).currentStrengthPoints = (this->super_Character).totalStrengthPoints;
  (this->super_Character).kills = 0;
  pDVar1 = (Dice *)operator_new(0x10);
  SozLibs::Dice::Dice(pDVar1,(this->super_Character).attackDieSides);
  (this->super_Character).attackDie = pDVar1;
  pDVar1 = (Dice *)operator_new(0x10);
  SozLibs::Dice::Dice(pDVar1,(this->super_Character).defenceDieSides);
  (this->super_Character).defenseDie = pDVar1;
  return;
}

Assistant:

ReptilePeople::ReptilePeople(std::string displayName)
{
    name = "ReptilePeople";
    this->displayName = displayName;

    alive = true;
    attackDieSides = 6;
    attackRolls = 3;
    defenceDieSides = 6;
    defenceRolls = 1;

    armor = 7;
    totalStrengthPoints = 18;
    currentStrengthPoints = totalStrengthPoints;
    kills = 0;

    attackDie = new SozLibs::Dice(attackDieSides);
    defenseDie = new SozLibs::Dice(defenceDieSides);
}